

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall
chrono::ChAssembly::IntToDescriptor
          (ChAssembly *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  pointer psVar9;
  element_type *peVar10;
  int iVar11;
  shared_ptr<chrono::fea::ChMesh> *mesh;
  pointer psVar12;
  int iVar13;
  int iVar14;
  shared_ptr<chrono::ChBody> *body;
  pointer psVar15;
  pointer psVar16;
  pointer psVar17;
  pointer psVar18;
  
  iVar13 = off_L - (this->super_ChPhysicsItem).offset_L;
  iVar14 = off_v - (this->super_ChPhysicsItem).offset_w;
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar15 = (this->bodylist).
                 super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar1; psVar15 = psVar15 + 1
      ) {
    iVar11 = (*(((psVar15->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar2 = (psVar15->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
                (peVar2,(ulong)((peVar2->super_ChPhysicsItem).offset_w + iVar14),v,R,
                 (ulong)((peVar2->super_ChPhysicsItem).offset_L + iVar13),L,Qc);
    }
  }
  psVar3 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar16 = (this->shaftlist).
                 super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar3; psVar16 = psVar16 + 1
      ) {
    iVar11 = (*(((psVar16->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar4 = (psVar16->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
                (peVar4,(ulong)((peVar4->super_ChPhysicsItem).offset_w + iVar14),v,R,
                 (ulong)((peVar4->super_ChPhysicsItem).offset_L + iVar13),L,Qc);
    }
  }
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar17 = (this->linklist).
                 super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar5; psVar17 = psVar17 + 1
      ) {
    iVar11 = (*(((psVar17->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar6 = (psVar17->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar6->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
                (peVar6,(ulong)((peVar6->super_ChPhysicsItem).offset_w + iVar14),v,R,
                 (ulong)((peVar6->super_ChPhysicsItem).offset_L + iVar13),L,Qc);
    }
  }
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (this->meshlist).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar7; psVar12 = psVar12 + 1
      ) {
    peVar8 = (psVar12->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar8->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x28])
              (peVar8,(ulong)((peVar8->super_ChIndexedNodes).super_ChPhysicsItem.offset_w + iVar14),
               v,R,(ulong)((peVar8->super_ChIndexedNodes).super_ChPhysicsItem.offset_L + iVar13),L,
               Qc);
  }
  psVar9 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar18 = (this->otherphysicslist).
                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar9; psVar18 = psVar18 + 1
      ) {
    iVar11 = (*(((psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ChObj)._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar10 = (psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      (*(peVar10->super_ChObj)._vptr_ChObj[0x28])
                (peVar10,(ulong)(peVar10->offset_w + iVar14),v,R,(ulong)(peVar10->offset_L + iVar13)
                 ,L,Qc);
    }
  }
  return;
}

Assistant:

void ChAssembly::IntToDescriptor(const unsigned int off_v,
                                 const ChStateDelta& v,
                                 const ChVectorDynamic<>& R,
                                 const unsigned int off_L,
                                 const ChVectorDynamic<>& L,
                                 const ChVectorDynamic<>& Qc) {
    unsigned int displ_L = off_L - this->offset_L;
    unsigned int displ_v = off_v - this->offset_w;

    for (auto& body : bodylist) {
        if (body->IsActive())
            body->IntToDescriptor(displ_v + body->GetOffset_w(), v, R, displ_L + body->GetOffset_L(), L, Qc);
    }

    for (auto& shaft : shaftlist) {
        if (shaft->IsActive())
            shaft->IntToDescriptor(displ_v + shaft->GetOffset_w(), v, R, displ_L + shaft->GetOffset_L(), L, Qc);
    }

    for (auto& link : linklist) {
        if (link->IsActive())
            link->IntToDescriptor(displ_v + link->GetOffset_w(), v, R, displ_L + link->GetOffset_L(), L, Qc);
    }

    for (auto& mesh : meshlist) {
        mesh->IntToDescriptor(displ_v + mesh->GetOffset_w(), v, R, displ_L + mesh->GetOffset_L(), L, Qc);
    }

    for (auto& item : otherphysicslist) {
        if (item->IsActive())
            item->IntToDescriptor(displ_v + item->GetOffset_w(), v, R, displ_L + item->GetOffset_L(), L, Qc);
    }
}